

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O2

void Buffer_To_Window(FIELD *field,WINDOW_conflict *win)

{
  long lVar1;
  short sVar2;
  undefined2 uVar3;
  char *pcVar4;
  short sVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  char *buf;
  
  if (win != (WINDOW_conflict *)0x0) {
    uVar3 = win->_maxy;
    sVar2 = win->_maxx;
    lVar1 = (long)(int)sVar2 + 1;
    buf = field->buf;
    sVar5 = -1;
    if (-1 < (short)uVar3) {
      sVar5 = uVar3;
    }
    iVar8 = -(int)buf;
    for (iVar6 = 0; sVar5 + 1 != iVar6; iVar6 = iVar6 + 1) {
      pcVar4 = After_End_Of_Data(buf,(int)lVar1);
      iVar7 = (int)pcVar4 + iVar8;
      if (0 < iVar7) {
        wmove(win,iVar6,0);
        waddnstr(win,buf,iVar7);
      }
      buf = buf + lVar1;
      iVar8 = iVar8 + ~(int)sVar2;
    }
    return;
  }
  __assert_fail("win && field",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CursesDialog/form/frm_driver.c"
                ,0x160,"void Buffer_To_Window(const FIELD *, WINDOW *)");
}

Assistant:

static void Buffer_To_Window(const FIELD  * field, WINDOW * win)
{
  int width, height;
  int len;
  int row;
  char *pBuffer;

  assert(win && field);

  getmaxyx(win, height, width);

  for(row=0, pBuffer=field->buf; 
      row < height; 
      row++, pBuffer += width )
    {
      if ((len = (int)( After_End_Of_Data( pBuffer, width ) - pBuffer )) > 0)
        {
          wmove( win, row, 0 );
          waddnstr( win, pBuffer, len );
        }
    }   
}